

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  RsRepeatSyntax *pRVar1;
  Token *unaff_retaddr;
  ExpressionSyntax *in_stack_00000008;
  Token *in_stack_00000010;
  Token *in_stack_00000018;
  BumpAllocator *in_stack_00000020;
  BumpAllocator *in_stack_000000f8;
  Token *in_stack_00000100;
  BumpAllocator *in_stack_ffffffffffffffa8;
  
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x7a4e70);
  deepClone<slang::syntax::ExpressionSyntax>
            ((ExpressionSyntax *)__child_stack,in_stack_ffffffffffffffa8);
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  not_null<slang::syntax::RsProdItemSyntax_*>::operator*
            ((not_null<slang::syntax::RsProdItemSyntax_*> *)0x7a4ead);
  deepClone<slang::syntax::RsProdItemSyntax>
            ((RsProdItemSyntax *)__child_stack,in_stack_ffffffffffffffa8);
  pRVar1 = BumpAllocator::
           emplace<slang::syntax::RsRepeatSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::RsProdItemSyntax&>
                     (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                      unaff_retaddr,(RsProdItemSyntax *)__fn);
  return (int)pRVar1;
}

Assistant:

static SyntaxNode* clone(const RsRepeatSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<RsRepeatSyntax>(
        node.keyword.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.expr, alloc),
        node.closeParen.deepClone(alloc),
        *deepClone<RsProdItemSyntax>(*node.item, alloc)
    );
}